

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O0

SHADER_STATUS __thiscall
Diligent::ShaderGLImpl::GetStatus(ShaderGLImpl *this,bool WaitForCompletion)

{
  bool bVar1;
  pointer this_00;
  SHADER_STATUS local_24;
  bool WaitForCompletion_local;
  ShaderGLImpl *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_Builder);
  if (bVar1) {
    this_00 = std::
              unique_ptr<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
              ::operator->(&this->m_Builder);
    bVar1 = ShaderBuilder::Tick(this_00,WaitForCompletion);
    if (bVar1) {
      std::
      unique_ptr<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
      ::reset(&this->m_Builder,(pointer)0x0);
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_Builder);
  if (bVar1) {
    local_24 = SHADER_STATUS_COMPILING;
  }
  else {
    bVar1 = GLObjectWrappers::GLObjWrapper::operator_cast_to_bool
                      ((GLObjWrapper *)&this->m_GLShaderObj);
    local_24 = SHADER_STATUS_FAILED;
    if (bVar1) {
      local_24 = SHADER_STATUS_READY;
    }
  }
  return local_24;
}

Assistant:

SHADER_STATUS ShaderGLImpl::GetStatus(bool WaitForCompletion)
{
    if (m_Builder)
    {
        if (m_Builder->Tick(WaitForCompletion))
        {
            m_Builder.reset();
        }
    }
    return m_Builder ? SHADER_STATUS_COMPILING : (m_GLShaderObj ? SHADER_STATUS_READY : SHADER_STATUS_FAILED);
}